

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXNumberOfPassiveStrays(ndicapi *pol)

{
  long lVar1;
  int n;
  char *dp;
  ndicapi *pol_local;
  
  if (pol->GxPassiveStray[0] == '\0') {
    pol_local._4_4_ = 0;
  }
  else {
    lVar1 = ndiSignedToLong(pol->GxPassiveStray,3);
    pol_local._4_4_ = (int)lVar1;
    if (pol_local._4_4_ < 0) {
      pol_local._4_4_ = 0;
    }
    else if (0x14 < pol_local._4_4_) {
      pol_local._4_4_ = 0x14;
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetGXNumberOfPassiveStrays(ndicapi* pol)
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0)
  {
    return 0;
  }
  if (n > 20)
  {
    return 20;
  }

  return n;
}